

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSphere.cpp
# Opt level: O1

void InternalSphere::Statistics
               (dgSphere *sphere,dgVector *eigenValues,dgVector *scaleVector,HaF32 *vertex,
               HaI32 vertexCount,HaI32 stride)

{
  ulong uVar1;
  dgMatrix *initialGuess;
  HaF32 *pHVar2;
  HaI32 HVar3;
  double dVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  float fVar22;
  double dVar23;
  float fVar24;
  double dVar25;
  double dVar26;
  float fVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  undefined1 in_XMM23 [16];
  
  if (vertexCount < 1) {
    dVar25 = 0.0;
    dVar23 = 0.0;
    dVar21 = 0.0;
    dVar28 = 0.0;
    dVar4 = 0.0;
    dVar26 = 0.0;
    dVar31 = 0.0;
    dVar30 = 0.0;
    dVar29 = 0.0;
  }
  else {
    pHVar2 = vertex + 2;
    auVar16 = ZEXT816(0);
    auVar17 = ZEXT816(0);
    auVar18 = ZEXT816(0);
    dVar26 = 0.0;
    auVar20 = ZEXT816(0);
    auVar19 = ZEXT816(0);
    dVar21 = 0.0;
    dVar23 = 0.0;
    dVar25 = 0.0;
    HVar3 = vertexCount;
    do {
      auVar6 = vmulss_avx512f(ZEXT416((uint)(scaleVector->super_dgTemplateVector<float>).m_x),
                              ZEXT416((uint)pHVar2[-2]));
      fVar22 = (scaleVector->super_dgTemplateVector<float>).m_y * (float)pHVar2[-1];
      auVar7 = vmulss_avx512f(ZEXT416((uint)(scaleVector->super_dgTemplateVector<float>).m_z),
                              ZEXT416((uint)*pHVar2));
      auVar8 = vcvtss2sd_avx512f(auVar6,auVar6);
      auVar9 = vcvtss2sd_avx512f(auVar7,auVar7);
      dVar4 = ABS(auVar9._0_8_);
      uVar1 = (long)dVar4 + 0x8010000000000001;
      auVar7 = vucomiss_avx512f(auVar7);
      if (((((POPCOUNT(uVar1 & 0xff) & 1U) == 0) ||
           (uVar1 != 0 && 0x7feffffffffffffe < (ulong)dVar4)) || (NAN(fVar22))) ||
         ((0x7fefffffffffffff < (ulong)ABS(auVar8._0_8_) ||
          (0x7fefffffffffffff < (long)ABS((double)fVar22))))) {
LAB_00878436:
        __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                      ,0x159,
                      "dgBigVector::dgBigVector(hacd::HaF64, hacd::HaF64, hacd::HaF64, hacd::HaF64)"
                     );
      }
      auVar10 = vmulss_avx512f(auVar6,auVar6);
      auVar10 = vcvtss2sd_avx512f(auVar10,auVar10);
      auVar15 = ZEXT416((uint)fVar22);
      auVar11 = vmulss_avx512f(auVar15,auVar15);
      auVar12 = vcvtss2sd_avx512f(auVar11,auVar11);
      auVar13 = vmulss_avx512f(auVar7,auVar7);
      auVar14 = vcvtss2sd_avx512f(auVar13,auVar13);
      uVar5 = auVar14._0_8_ & 0x7fffffffffffffff;
      uVar1 = uVar5 + 0x8010000000000001;
      vucomiss_avx512f(auVar13);
      if (((((POPCOUNT(uVar1 & 0xff) & 1U) == 0) ||
           ((uVar1 != 0 && 0x7feffffffffffffe < uVar5 ||
            (vucomiss_avx512f(auVar11), uVar1 == 0 || 0x7feffffffffffffe >= uVar5)))) ||
          (0x7fefffffffffffff < (auVar10._0_8_ & 0x7fffffffffffffff))) ||
         (0x7fefffffffffffff < (auVar12._0_8_ & 0x7fffffffffffffff))) goto LAB_00878436;
      auVar11 = vmulss_avx512f(auVar6,auVar15);
      auVar11 = vcvtss2sd_avx512f(auVar11,auVar11);
      auVar6 = vmulss_avx512f(auVar6,auVar7);
      auVar13 = vcvtss2sd_avx512f(auVar6,auVar6);
      auVar7 = vmulss_avx512f(auVar15,auVar7);
      auVar15 = vcvtss2sd_avx512f(auVar7,auVar7);
      dVar4 = ABS(auVar15._0_8_);
      uVar1 = (long)dVar4 + 0x8010000000000001;
      vucomiss_avx512f(auVar7);
      if (((((POPCOUNT(uVar1 & 0xff) & 1U) == 0) ||
           (uVar1 != 0 && 0x7feffffffffffffe < (ulong)dVar4)) ||
          (vucomiss_avx512f(auVar6), uVar1 == 0 || 0x7feffffffffffffe >= (ulong)dVar4)) ||
         ((0x7fefffffffffffff < (auVar11._0_8_ & 0x7fffffffffffffff) ||
          (0x7fefffffffffffff < (auVar13._0_8_ & 0x7fffffffffffffff))))) goto LAB_00878436;
      dVar25 = auVar8._0_8_ + dVar25;
      dVar23 = (double)fVar22 + dVar23;
      dVar21 = auVar9._0_8_ + dVar21;
      auVar16 = vaddsd_avx512f(auVar16,auVar14);
      dVar29 = auVar16._0_8_;
      auVar17 = vaddsd_avx512f(auVar17,auVar12);
      dVar30 = auVar17._0_8_;
      auVar18 = vaddsd_avx512f(auVar18,auVar10);
      dVar31 = auVar18._0_8_;
      auVar19 = vaddsd_avx512f(auVar19,auVar11);
      dVar28 = auVar19._0_8_;
      auVar20 = vaddsd_avx512f(auVar20,auVar13);
      dVar4 = auVar20._0_8_;
      dVar26 = auVar15._0_8_ + dVar26;
      pHVar2 = pHVar2 + stride;
      HVar3 = HVar3 + -1;
    } while (HVar3 != 0);
  }
  auVar20 = vcvtsi2sd_avx512f(in_XMM23,vertexCount);
  dVar32 = 1.0 / auVar20._0_8_;
  if ((((long)ABS(dVar32 * dVar31) < 0x7ff0000000000000) &&
      ((long)ABS(dVar32 * dVar30) < 0x7ff0000000000000)) &&
     ((long)ABS(dVar32 * dVar29) < 0x7ff0000000000000)) {
    if ((((long)ABS(dVar32 * dVar28) < 0x7ff0000000000000) &&
        ((long)ABS(dVar32 * dVar4) < 0x7ff0000000000000)) &&
       ((long)ABS(dVar32 * dVar26) < 0x7ff0000000000000)) {
      if ((((long)ABS(dVar32 * dVar25) < 0x7ff0000000000000) &&
          ((long)ABS(dVar32 * dVar23) < 0x7ff0000000000000)) &&
         ((long)ABS(dVar32 * dVar21) < 0x7ff0000000000000)) {
        auVar16._8_8_ = 0;
        auVar16._0_8_ = dVar32 * dVar25;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = dVar32 * dVar31;
        auVar20 = vfnmadd231sd_fma(auVar20,auVar16,auVar16);
        auVar18._8_8_ = 0;
        auVar18._0_8_ = dVar32 * dVar23;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = dVar32 * dVar28;
        auVar19 = vfnmadd231sd_fma(auVar19,auVar16,auVar18);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = dVar32 * dVar21;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = dVar32 * dVar4;
        auVar16 = vfnmadd231sd_fma(auVar7,auVar17,auVar16);
        fVar27 = (float)auVar19._0_8_;
        fVar22 = (float)auVar16._0_8_;
        if (((!NAN(fVar22)) && ((uint)ABS(fVar22) < 0x7f800000)) &&
           ((!NAN(fVar27) &&
            (((uint)ABS(fVar27) < 0x7f800000 && ((uint)ABS((float)auVar20._0_8_) < 0x7f800000))))))
        {
          auVar6._8_8_ = 0;
          auVar6._0_8_ = dVar32 * dVar26;
          auVar19 = vfnmadd231sd_fma(auVar6,auVar18,auVar17);
          auVar8._8_8_ = 0;
          auVar8._0_8_ = dVar32 * dVar30;
          auVar16 = vfnmadd231sd_fma(auVar8,auVar18,auVar18);
          (sphere->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_x = (float)auVar20._0_8_;
          (sphere->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_y = fVar27;
          (sphere->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_z = fVar22;
          (sphere->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_w = 0.0;
          fVar24 = (float)auVar19._0_8_;
          if ((!NAN(fVar24)) &&
             (((uint)ABS(fVar24) < 0x7f800000 && ((uint)ABS((float)auVar16._0_8_) < 0x7f800000)))) {
            auVar9._8_8_ = 0;
            auVar9._0_8_ = dVar32 * dVar29;
            auVar20 = vfnmadd213sd_fma(auVar17,auVar17,auVar9);
            (sphere->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_x = fVar27;
            (sphere->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_y = (float)auVar16._0_8_;
            (sphere->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_z = fVar24;
            (sphere->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_w = 0.0;
            if ((uint)ABS((float)auVar20._0_8_) < 0x7f800000) {
              (sphere->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_x = fVar22;
              (sphere->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_y = fVar24;
              (sphere->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_z =
                   (float)auVar20._0_8_;
              (sphere->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_w = 0.0;
              initialGuess = dgGetIdentityMatrix();
              dgMatrix::EigenVectors(&sphere->super_dgMatrix,eigenValues,initialGuess);
              return;
            }
          }
        }
        __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                      ,0x134,
                      "dgVector::dgVector(hacd::HaF32, hacd::HaF32, hacd::HaF32, hacd::HaF32)");
      }
    }
  }
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
}

Assistant:

static void Statistics (dgSphere &sphere, dgVector &eigenValues, dgVector &scaleVector, const hacd::HaF32 vertex[], hacd::HaI32 vertexCount, hacd::HaI32 stride)
	{
		dgBigVector var (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
		dgBigVector cov (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
		dgBigVector massCenter (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
	
		const hacd::HaF32* ptr = vertex;
		for (hacd::HaI32 i = 0; i < vertexCount; i ++) {
			hacd::HaF32 x = ptr[0] * scaleVector.m_x;
			hacd::HaF32 y = ptr[1] * scaleVector.m_y;
			hacd::HaF32 z = ptr[2] * scaleVector.m_z;
			ptr += stride;
			massCenter += dgBigVector (x, y, z, hacd::HaF32 (0.0f));
			var += dgBigVector (x * x, y * y, z * z, hacd::HaF32 (0.0f));
			cov += dgBigVector (x * y, x * z, y * z, hacd::HaF32 (0.0f));
		}
	
		hacd::HaF64 k = hacd::HaF64 (1.0) / vertexCount;
		var = var.Scale (k);
		cov = cov.Scale (k);
		massCenter = massCenter.Scale (k);
	
		hacd::HaF64 Ixx = var.m_x - massCenter.m_x * massCenter.m_x;
		hacd::HaF64 Iyy = var.m_y - massCenter.m_y * massCenter.m_y;
		hacd::HaF64 Izz = var.m_z - massCenter.m_z * massCenter.m_z;
	
		hacd::HaF64 Ixy = cov.m_x - massCenter.m_x * massCenter.m_y;
		hacd::HaF64 Ixz = cov.m_y - massCenter.m_x * massCenter.m_z;
		hacd::HaF64 Iyz = cov.m_z - massCenter.m_y * massCenter.m_z;
	
		sphere.m_front = dgVector (hacd::HaF32(Ixx), hacd::HaF32(Ixy), hacd::HaF32(Ixz), hacd::HaF32 (0.0f));
		sphere.m_up    = dgVector (hacd::HaF32(Ixy), hacd::HaF32(Iyy), hacd::HaF32(Iyz), hacd::HaF32 (0.0f));
		sphere.m_right = dgVector (hacd::HaF32(Ixz), hacd::HaF32(Iyz), hacd::HaF32(Izz), hacd::HaF32 (0.0f));
 		sphere.EigenVectors (eigenValues);
	}